

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.h
# Opt level: O0

StringVector * __thiscall
CoreML::Specification::CoreMLModels::WordTagger::mutable_stringtags(WordTagger *this)

{
  bool bVar1;
  StringVector *this_00;
  WordTagger *this_local;
  
  bVar1 = has_stringtags(this);
  if (!bVar1) {
    clear_Tags(this);
    set_has_stringtags(this);
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->Tags_).stringtags_ = this_00;
  }
  return (this->Tags_).stringtags_;
}

Assistant:

inline ::CoreML::Specification::StringVector* WordTagger::mutable_stringtags() {
  if (!has_stringtags()) {
    clear_Tags();
    set_has_stringtags();
    Tags_.stringtags_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CoreMLModels.WordTagger.stringTags)
  return Tags_.stringtags_;
}